

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hive_partitioning.cpp
# Opt level: O1

void duckdb::HivePartitioning::ApplyFiltersToFileList
               (ClientContext *context,vector<duckdb::OpenFileInfo,_true> *files,
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *filters,HivePartitioningFilterInfo *filter_info,MultiFilePushdownInfo *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong *puVar2;
  pointer pcVar3;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  ulong uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  MultiFilePushdownInfo *pMVar11;
  bool bVar12;
  int iVar13;
  const_iterator cVar14;
  _Rb_tree_node_base *p_Var15;
  reference this;
  pointer pEVar16;
  type expr;
  __node_base_ptr p_Var17;
  InternalException *pIVar18;
  _Alloc_hider _Var19;
  size_type __n;
  pointer *__ptr;
  idx_t index;
  __node_base_ptr p_Var20;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var21;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar22;
  Value result_value;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> filter_copy;
  vector<bool,_true> have_preserved_filter;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  partitions;
  unordered_map<unsigned_long,_duckdb::PartitioningColumnValue,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::PartitioningColumnValue>_>_>
  known_values;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filters_applied_to_files;
  undefined1 local_278 [20];
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_258;
  undefined8 local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  undefined1 local_238 [32];
  Val VStack_218;
  element_type *local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  HivePartitioningFilterInfo *local_1f0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1e8;
  pointer local_1e0;
  undefined1 local_1d8 [16];
  _Alloc_hider local_1c8;
  element_type *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  optional_idx local_1a8;
  reference local_1a0;
  element_type *local_198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  undefined4 local_188;
  long local_180;
  uint local_178;
  undefined8 local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  element_type *local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> local_148;
  pointer local_128;
  pointer puStack_120;
  pointer local_118;
  MultiFilePushdownInfo *local_108;
  ClientContext *local_100;
  size_type local_f8;
  idx_t local_f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e8;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::PartitioningColumnValue>,_std::allocator<std::pair<const_unsigned_long,_duckdb::PartitioningColumnValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_b8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_80;
  LogicalType local_48;
  
  local_148.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238._0_8_ = local_238._0_8_ & 0xffffffffffffff00;
  local_100 = context;
  ::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_190,
             (long)(filters->
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(filters->
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(bool *)local_238,
             (allocator_type *)local_278);
  local_128 = (pointer)0x0;
  puStack_120 = (pointer)0x0;
  local_118 = (pointer)0x0;
  local_80._M_buckets = &local_80._M_single_bucket;
  local_80._M_bucket_count = 1;
  local_80._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_80._M_element_count = 0;
  local_80._M_rehash_policy._M_max_load_factor = 1.0;
  local_80._M_rehash_policy._M_next_resize = 0;
  local_80._M_single_bucket = (__node_base_ptr)0x0;
  local_f0 = info->table_index;
  local_108 = info;
  if (((filter_info->filename_enabled != false) || (filter_info->hive_enabled == true)) &&
     ((filters->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (filters->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    local_1a8.index = (idx_t)files;
    if ((files->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
        super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (files->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
        super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
        super__Vector_impl_data._M_start) {
      index = 0;
    }
    else {
      __n = 0;
      local_1f0 = filter_info;
      do {
        _Var21._M_head_impl = (Expression *)(local_278 + 0x10);
        local_f8 = __n;
        local_1a0 = vector<duckdb::OpenFileInfo,_true>::operator[]
                              ((vector<duckdb::OpenFileInfo,_true> *)local_1a8.index,__n);
        local_b8._M_buckets = &local_b8._M_single_bucket;
        local_b8._M_bucket_count = 1;
        local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_b8._M_element_count = 0;
        local_b8._M_rehash_policy._M_max_load_factor = 1.0;
        local_b8._M_rehash_policy._M_next_resize = 0;
        local_b8._M_single_bucket = (__node_base_ptr)0x0;
        if (local_1f0->filename_enabled == true) {
          local_238._16_8_ = (pointer)0x656d616e656c6966;
          local_238._8_8_ = (Expression *)0x8;
          local_238._24_8_ = local_238._24_8_ & 0xffffffffffffff00;
          local_238._0_8_ = local_238 + 0x10;
          cVar14 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)local_1f0,(key_type *)local_238);
          if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
            operator_delete((void *)local_238._0_8_);
          }
          if (cVar14.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
              ._M_cur != (__node_type *)0x0) {
            pcVar3 = (local_1a0->path)._M_dataplus._M_p;
            local_1c8._M_p = (pointer)&local_1b8;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)(local_1d8 + 0x10),pcVar3,
                       pcVar3 + (local_1a0->path)._M_string_length);
            local_208 = local_1c0;
            uVar7 = stack0xfffffffffffffd98;
            uVar6 = (ulong)stack0xfffffffffffffd98 >> 8;
            stack0xfffffffffffffd98 = uVar6 << 8;
            uVar8 = stack0xfffffffffffffd98;
            local_238._8_8_ = local_238 + 0x18;
            VStack_218.hugeint.upper = (int64_t)&local_200;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_p == &local_1b8) {
              local_248._8_8_ = local_1b8._8_8_;
              local_258 = &local_248;
            }
            else {
              local_258 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1c8._M_p;
            }
            local_248._M_allocated_capacity._1_7_ = local_1b8._M_allocated_capacity._1_7_;
            local_248._M_local_buf[0] = local_1b8._M_local_buf[0];
            local_1c0 = (element_type *)0x0;
            local_1b8._M_local_buf[0] = '\0';
            local_238._0_8_ =
                 *(long *)((long)cVar14.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                 ._M_cur + 0x28);
            uStack_264 = SUB84(uVar7,4);
            local_238._24_8_ = CONCAT44(uStack_264,(int)uVar8);
            VStack_218.integer = uStack_260;
            VStack_218.interval.days = uStack_25c;
            local_238._16_8_ = (pointer)0x0;
            local_278._8_8_ = 0;
            stack0xfffffffffffffd98 = uVar6 << 8;
            if (local_258 == &local_248) {
              local_200._8_4_ = local_248._8_4_;
              local_200._12_4_ = local_248._12_4_;
            }
            else {
              VStack_218.hugeint.upper = (int64_t)local_258;
            }
            local_200._M_allocated_capacity = local_248._M_allocated_capacity;
            local_250 = 0;
            local_248._M_allocated_capacity =
                 (ulong)(uint7)local_1b8._M_allocated_capacity._1_7_ << 8;
            local_278._0_8_ = _Var21._M_head_impl;
            local_258 = &local_248;
            local_1c8._M_p = (pointer)&local_1b8;
            ::std::
            _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::PartitioningColumnValue>,std::allocator<std::pair<unsigned_long_const,duckdb::PartitioningColumnValue>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<unsigned_long,duckdb::PartitioningColumnValue>>
                      ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::PartitioningColumnValue>,std::allocator<std::pair<unsigned_long_const,duckdb::PartitioningColumnValue>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&local_b8);
            if (VStack_218._8_8_ != &local_200) {
              operator_delete((void *)VStack_218.hugeint.upper);
            }
            if ((Expression *)local_238._8_8_ != (Expression *)(local_238 + 0x18)) {
              operator_delete((void *)local_238._8_8_);
            }
            if (local_258 != &local_248) {
              operator_delete(local_258);
            }
            if ((Expression *)local_278._0_8_ != _Var21._M_head_impl) {
              operator_delete((void *)local_278._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_p != &local_1b8) {
              operator_delete(local_1c8._M_p);
            }
          }
        }
        if (local_1f0->hive_enabled == true) {
          Parse((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_e8,&local_1a0->path);
          for (p_Var15 = (_Rb_tree_node_base *)
                         local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
              p_Var15 != (_Rb_tree_node_base *)((long)&local_e8 + 8U);
              p_Var15 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var15)) {
            cVar14 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)local_1f0,(key_type *)(p_Var15 + 1));
            if (cVar14.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                ._M_cur != (__node_type *)0x0) {
              local_1e8._M_head_impl = (Expression *)local_1d8;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1e8,*(long *)(p_Var15 + 1),
                         (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
              local_168 = &local_158;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_168,*(long *)(p_Var15 + 2),
                         (long)&(p_Var15[2]._M_parent)->_M_color + *(long *)(p_Var15 + 2));
              uVar10 = local_158._M_allocated_capacity._0_4_;
              local_208 = local_160;
              uVar9 = local_1d8._0_4_;
              local_238._16_8_ = local_1e0;
              local_238._8_8_ = local_238 + 0x18;
              if (local_1e8._M_head_impl == (Expression *)local_1d8) {
                uStack_260 = local_1d8._8_4_;
                uStack_25c = local_1d8._12_4_;
                local_278._0_8_ = _Var21._M_head_impl;
              }
              else {
                local_278._0_8_ = local_1e8._M_head_impl;
              }
              uStack_264 = local_1d8._4_4_;
              local_278._16_4_ = local_1d8._0_4_;
              local_1e0 = (pointer)0x0;
              local_1d8._0_4_ = local_1d8._0_4_ & 0xffffff00;
              if (local_168 == &local_158) {
                local_248._12_4_ = local_158._12_4_;
                local_248._8_4_ = local_158._8_4_;
                local_258 = &local_248;
              }
              else {
                local_258 = local_168;
              }
              local_248._M_allocated_capacity._4_4_ = local_158._M_allocated_capacity._4_4_;
              local_248._M_allocated_capacity._0_4_ = local_158._M_allocated_capacity._0_4_;
              local_160 = (element_type *)0x0;
              local_158._M_allocated_capacity._0_4_ =
                   local_158._M_allocated_capacity._0_4_ & 0xffffff00;
              local_238._0_8_ =
                   *(long *)((long)cVar14.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                   ._M_cur + 0x28);
              if ((Expression *)local_278._0_8_ == _Var21._M_head_impl) {
                local_238._24_8_ = CONCAT44(local_1d8._4_4_,uVar9);
                VStack_218.integer = uStack_260;
                VStack_218.interval.days = uStack_25c;
              }
              else {
                local_238._8_8_ = local_278._0_8_;
                local_238._24_8_ = stack0xfffffffffffffd98;
              }
              local_278._8_8_ = 0;
              stack0xfffffffffffffd98 = stack0xfffffffffffffd98 & 0xffffffffffffff00;
              VStack_218.hugeint.upper = (int64_t)&local_200;
              if (local_258 == &local_248) {
                local_200._M_allocated_capacity =
                     CONCAT44(local_158._M_allocated_capacity._4_4_,uVar10);
                local_200._8_4_ = local_248._8_4_;
                local_200._12_4_ = local_248._12_4_;
              }
              else {
                VStack_218.hugeint.upper = (int64_t)local_258;
                local_200._M_allocated_capacity = local_248._M_allocated_capacity;
              }
              local_250 = 0;
              local_248._M_allocated_capacity = local_248._M_allocated_capacity & 0xffffffffffffff00
              ;
              local_278._0_8_ = _Var21._M_head_impl;
              local_258 = &local_248;
              local_1e8._M_head_impl = (Expression *)local_1d8;
              local_168 = &local_158;
              ::std::
              _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::PartitioningColumnValue>,std::allocator<std::pair<unsigned_long_const,duckdb::PartitioningColumnValue>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<std::pair<unsigned_long,duckdb::PartitioningColumnValue>>
                        ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::PartitioningColumnValue>,std::allocator<std::pair<unsigned_long_const,duckdb::PartitioningColumnValue>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)&local_b8);
              if (VStack_218._8_8_ != &local_200) {
                operator_delete((void *)VStack_218.hugeint.upper);
              }
              if ((Expression *)local_238._8_8_ != (Expression *)(local_238 + 0x18)) {
                operator_delete((void *)local_238._8_8_);
              }
              if (local_258 != &local_248) {
                operator_delete(local_258);
              }
              if ((Expression *)local_278._0_8_ != _Var21._M_head_impl) {
                operator_delete((void *)local_278._0_8_);
              }
              if (local_168 != &local_158) {
                operator_delete(local_168);
              }
              if (local_1e8._M_head_impl != (Expression *)local_1d8) {
                operator_delete(local_1e8._M_head_impl);
              }
            }
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_e8);
        }
        local_1c8._M_p = (pointer)0x0;
        if ((filters->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (filters->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
LAB_00389dcc:
          std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::push_back
                    (&local_148,local_1a0);
        }
        else {
          local_198 = (element_type *)0x0;
          do {
            this = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::operator[](filters,(size_type)local_1c8._M_p);
            pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->(this);
            (*(pEVar16->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_1e8,pEVar16);
            ConvertKnownColRefToConstants
                      (local_100,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&local_1e8,
                       (unordered_map<unsigned_long,_duckdb::PartitioningColumnValue,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::PartitioningColumnValue>_>_>
                        *)&local_b8,local_f0);
            LogicalType::LogicalType(&local_48,SQLNULL);
            Value::Value((Value *)local_238,&local_48);
            LogicalType::~LogicalType(&local_48);
            pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                    *)&local_1e8);
            iVar13 = (*(pEVar16->super_BaseExpression)._vptr_BaseExpression[5])(pEVar16);
            if ((char)iVar13 == '\0') {
LAB_00389be0:
              _Var19._M_p = local_1c8._M_p;
              paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)((ulong)local_178 + (local_180 - (long)local_190._M_pi) * 8);
              if (paVar1 <= local_1c8._M_p) {
                pIVar18 = (InternalException *)__cxa_allocate_exception(0x10);
                local_278._0_8_ = (long)local_278 + 0x10;
                local_e8._M_impl._0_8_ = &DAT_00000037;
                local_278._0_8_ =
                     ::std::__cxx11::string::_M_create((ulong *)local_278,(ulong)&local_e8);
                stack0xfffffffffffffd98 = local_e8._M_impl._0_8_;
                builtin_strncpy((char *)(local_278._0_8_ + 0x20),"thin vec",8);
                builtin_strncpy((char *)(local_278._0_8_ + 0x28),"tor of s",8);
                builtin_strncpy((char *)(local_278._0_8_ + 0x10),"ess inde",8);
                builtin_strncpy((char *)(local_278._0_8_ + 0x18),"x %ld wi",8);
                *(undefined8 *)local_278._0_8_ = 0x6574706d65747441;
                builtin_strncpy((char *)(local_278._0_8_ + 8),"d to acc",8);
                builtin_strncpy((char *)(local_278._0_8_ + 0x2f),"size %ld",8);
                local_278._8_8_ = local_e8._M_impl._0_8_;
                *(undefined1 *)(local_e8._M_impl._0_8_ + local_278._0_8_) = 0;
                InternalException::InternalException<unsigned_long,unsigned_long>
                          (pIVar18,(string *)local_278,(unsigned_long)_Var19._M_p,
                           (unsigned_long)paVar1);
                __cxa_throw(pIVar18,&InternalException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              _Var19._M_p = (pointer)(local_1c8._M_p + 0x3f);
              if (-1 < (long)local_1c8._M_p) {
                _Var19._M_p = local_1c8._M_p;
              }
              if ((*(ulong *)((long)local_190._M_pi +
                             (ulong)(((ulong)local_1c8._M_p & 0x800000000000003f) <
                                    0x8000000000000001) * 8 + ((long)_Var19._M_p >> 6) * 8 + -8) >>
                   ((ulong)local_1c8._M_p & 0x3f) & 1) == 0) {
                pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          ::operator->(this);
                (*(pEVar16->super_BaseExpression)._vptr_BaseExpression[0x11])(local_278,pEVar16);
                ::std::
                vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                ::
                emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                          ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                            *)&local_128,
                           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)local_278);
                if ((Expression *)local_278._0_8_ != (Expression *)0x0) {
                  (*(code *)((BaseExpression *)local_278._0_8_)->_vptr_BaseExpression[1])();
                }
                _Var19._M_p = local_1c8._M_p;
                paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)((ulong)local_178 + (local_180 - (long)local_190._M_pi) * 8);
                if (paVar1 <= local_1c8._M_p) {
                  pIVar18 = (InternalException *)__cxa_allocate_exception(0x10);
                  local_278._0_8_ = (long)local_278 + 0x10;
                  local_e8._M_impl._0_8_ = &DAT_00000037;
                  local_278._0_8_ =
                       ::std::__cxx11::string::_M_create((ulong *)local_278,(ulong)&local_e8);
                  stack0xfffffffffffffd98 = local_e8._M_impl._0_8_;
                  builtin_strncpy((char *)(local_278._0_8_ + 0x20),"thin vec",8);
                  builtin_strncpy((char *)(local_278._0_8_ + 0x28),"tor of s",8);
                  builtin_strncpy((char *)(local_278._0_8_ + 0x10),"ess inde",8);
                  builtin_strncpy((char *)(local_278._0_8_ + 0x18),"x %ld wi",8);
                  *(undefined8 *)local_278._0_8_ = 0x6574706d65747441;
                  builtin_strncpy((char *)(local_278._0_8_ + 8),"d to acc",8);
                  builtin_strncpy((char *)(local_278._0_8_ + 0x2f),"size %ld",8);
                  local_278._8_8_ = local_e8._M_impl._0_8_;
                  *(undefined1 *)(local_e8._M_impl._0_8_ + local_278._0_8_) = 0;
                  InternalException::InternalException<unsigned_long,unsigned_long>
                            (pIVar18,(string *)local_278,(unsigned_long)_Var19._M_p,
                             (unsigned_long)paVar1);
                  __cxa_throw(pIVar18,&InternalException::typeinfo,
                              ::std::runtime_error::~runtime_error);
                }
                _Var19._M_p = (pointer)(local_1c8._M_p + 0x3f);
                if (-1 < (long)local_1c8._M_p) {
                  _Var19._M_p = local_1c8._M_p;
                }
                puVar2 = (ulong *)((long)local_190._M_pi +
                                  (ulong)(((ulong)local_1c8._M_p & 0x800000000000003f) <
                                         0x8000000000000001) * 8 + ((long)_Var19._M_p >> 6) * 8 + -8
                                  );
                *puVar2 = *puVar2 | 1L << ((byte)local_1c8._M_p & 0x3f);
              }
            }
            else {
              pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                      *)&local_1e8);
              iVar13 = (*(pEVar16->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar16);
              if ((char)iVar13 == '\0') goto LAB_00389be0;
              expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)&local_1e8);
              bVar12 = ExpressionExecutor::TryEvaluateScalar(local_100,expr,(Value *)local_238);
              if (!bVar12) goto LAB_00389be0;
              if ((local_238[0x18] != '\0') ||
                 (bVar12 = Value::GetValue<bool>((Value *)local_238), !bVar12)) {
                p_Var4 = local_80._M_buckets[(ulong)local_1c8._M_p % local_80._M_bucket_count];
                p_Var17 = (__node_base_ptr)0x0;
                if ((p_Var4 != (__node_base_ptr)0x0) &&
                   (p_Var17 = p_Var4, p_Var20 = p_Var4->_M_nxt,
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_1c8._M_p !=
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)p_Var4->_M_nxt[1]._M_nxt)) {
                  while (p_Var5 = p_Var20->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
                    p_Var17 = (__node_base_ptr)0x0;
                    if (((ulong)p_Var5[1]._M_nxt % local_80._M_bucket_count !=
                         (ulong)local_1c8._M_p % local_80._M_bucket_count) ||
                       (p_Var17 = p_Var20, p_Var20 = p_Var5,
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_1c8._M_p ==
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)p_Var5[1]._M_nxt)) goto LAB_00389d46;
                  }
                  p_Var17 = (__node_base_ptr)0x0;
                }
LAB_00389d46:
                if ((p_Var17 == (__node_base_ptr)0x0) ||
                   (local_198 = (element_type *)CONCAT71((int7)((ulong)local_1c8._M_p >> 8),1),
                   p_Var17->_M_nxt == (_Hash_node_base *)0x0)) {
                  pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            ::operator->(this);
                  (*(pEVar16->super_BaseExpression)._vptr_BaseExpression[8])(local_278,pEVar16);
                  ::std::__cxx11::string::_M_append((char *)local_108->extra_info,local_278._0_8_);
                  if ((Expression *)local_278._0_8_ != (Expression *)(local_278 + 0x10)) {
                    operator_delete((void *)local_278._0_8_);
                  }
                  local_278._0_8_ = &local_80;
                  pVar22 = ::std::
                           _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                           ::
                           _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                                     ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                       *)local_278._0_8_,local_1d8 + 0x10,local_278);
                  local_198 = (element_type *)
                              CONCAT71(pVar22.first.super__Node_iterator_base<unsigned_long,_false>.
                                       _M_cur._1_7_,1);
                }
              }
            }
            Value::~Value((Value *)local_238);
            if (local_1e8._M_head_impl != (Expression *)0x0) {
              (*(code *)((local_1e8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
            }
            local_1c8._M_p = local_1c8._M_p + 1;
          } while (local_1c8._M_p <
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)(filters->
                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ).
                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(filters->
                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ).
                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3));
          if (((ulong)local_198 & 1) == 0) goto LAB_00389dcc;
        }
        std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::PartitioningColumnValue>,_std::allocator<std::pair<const_unsigned_long,_duckdb::PartitioningColumnValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_b8);
        __n = local_f8 + 1;
        index = ((long)*(pointer *)(local_1a8.index + 8) - *(long *)local_1a8.index >> 4) *
                -0x5555555555555555;
      } while (__n < index);
    }
    optional_idx::optional_idx((optional_idx *)local_238,index);
    pMVar11 = local_108;
    (local_108->extra_info->total_files).index = local_238._0_8_;
    optional_idx::optional_idx
              ((optional_idx *)local_238,
               ((long)local_148.
                      super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_148.
                      super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
    (pMVar11->extra_info->filtered_files).index = local_238._0_8_;
    local_238._0_8_ =
         (filters->
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ).
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_238._8_8_ =
         (filters->
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ).
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_238._16_8_ =
         (filters->
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ).
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (filters->
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ).
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_128;
    (filters->
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ).
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puStack_120;
    (filters->
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ).
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_118;
    local_128 = (pointer)0x0;
    puStack_120 = (pointer)0x0;
    local_118 = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_238);
    local_238._0_8_ = *(undefined8 *)local_1a8.index;
    local_238._8_8_ = *(pointer *)(local_1a8.index + 8);
    local_238._16_8_ = *(pointer *)(local_1a8.index + 0x10);
    *(pointer *)local_1a8.index =
         local_148.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
         _M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(local_1a8.index + 8) =
         local_148.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)(local_1a8.index + 0x10) =
         local_148.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_148.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
              ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)local_238);
  }
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_80);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_128);
  if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(local_190._M_pi);
    local_190._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_188 = 0;
    local_180 = 0;
    local_178 = 0;
    local_170 = 0;
  }
  std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector(&local_148);
  return;
}

Assistant:

void HivePartitioning::ApplyFiltersToFileList(ClientContext &context, vector<OpenFileInfo> &files,
                                              vector<unique_ptr<Expression>> &filters,
                                              const HivePartitioningFilterInfo &filter_info,
                                              MultiFilePushdownInfo &info) {

	vector<OpenFileInfo> pruned_files;
	vector<bool> have_preserved_filter(filters.size(), false);
	vector<unique_ptr<Expression>> pruned_filters;
	unordered_set<idx_t> filters_applied_to_files;
	auto table_index = info.table_index;

	if ((!filter_info.filename_enabled && !filter_info.hive_enabled) || filters.empty()) {
		return;
	}

	for (idx_t i = 0; i < files.size(); i++) {
		auto &file = files[i];
		bool should_prune_file = false;
		auto known_values = GetKnownColumnValues(file.path, filter_info);

		for (idx_t j = 0; j < filters.size(); j++) {
			auto &filter = filters[j];
			unique_ptr<Expression> filter_copy = filter->Copy();
			ConvertKnownColRefToConstants(context, filter_copy, known_values, table_index);
			// Evaluate the filter, if it can be evaluated here, we can not prune this filter
			Value result_value;

			if (!filter_copy->IsScalar() || !filter_copy->IsFoldable() ||
			    !ExpressionExecutor::TryEvaluateScalar(context, *filter_copy, result_value)) {
				// can not be evaluated only with the filename/hive columns added, we can not prune this filter
				if (!have_preserved_filter[j]) {
					pruned_filters.emplace_back(filter->Copy());
					have_preserved_filter[j] = true;
				}
			} else if (result_value.IsNull() || !result_value.GetValue<bool>()) {
				// filter evaluates to false
				should_prune_file = true;
				// convert the filter to a table filter.
				if (filters_applied_to_files.find(j) == filters_applied_to_files.end()) {
					info.extra_info.file_filters += filter->ToString();
					filters_applied_to_files.insert(j);
				}
			}
		}

		if (!should_prune_file) {
			pruned_files.push_back(file);
		}
	}

	D_ASSERT(filters.size() >= pruned_filters.size());

	info.extra_info.total_files = files.size();
	info.extra_info.filtered_files = pruned_files.size();

	filters = std::move(pruned_filters);
	files = std::move(pruned_files);
}